

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

double duckdb::LogBaseOperator::Operation<double,double,double>(double b,double x)

{
  OutOfRangeException *this;
  double dVar1;
  double dVar2;
  string local_40;
  
  dVar1 = Log10Operator::Operation<double,double>(b);
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"divison by zero in based logarithm","");
    OutOfRangeException::OutOfRangeException(this,&local_40);
    __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  dVar2 = Log10Operator::Operation<double,double>(x);
  return dVar2 / dVar1;
}

Assistant:

static inline TR Operation(TA b, TB x) {
		auto divisor = Log10Operator::Operation<TA, TR>(b);
		if (divisor == 0) {
			throw OutOfRangeException("divison by zero in based logarithm");
		}
		return Log10Operator::Operation<TB, TR>(x) / divisor;
	}